

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

ByteData256 * __thiscall
cfd::core::AbstractTransaction::GetHash
          (ByteData256 *__return_storage_ptr__,AbstractTransaction *this,bool has_witness)

{
  ByteData buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  ByteData local_28;
  
  (*this->_vptr_AbstractTransaction[0xd])(&local_28);
  ByteData::GetBytes(&local_40,&local_28);
  HashUtil::Sha256D(__return_storage_ptr__,&local_40);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 AbstractTransaction::GetHash(bool has_witness) const {
  ByteData buffer = GetByteData(has_witness);
  // sha256d hash
  return HashUtil::Sha256D(buffer.GetBytes());
}